

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructDeserializer.hpp
# Opt level: O0

void mserialize::
     StructDeserializer<binlog::WriterProp,_std::integral_constant<unsigned_long_binlog::WriterProp::*,_&binlog::WriterProp::id>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::WriterProp::*,_&binlog::WriterProp::name>,_std::integral_constant<unsigned_long_binlog::WriterProp::*,_&binlog::WriterProp::batchSize>_>
     ::deserialize<binlog::Range>(WriterProp *t,Range *istream)

{
  offset_in_WriterProp_to_unsigned_long in_stack_ffffffffffffffd8;
  uint uVar1;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 uVar2;
  
  uVar1 = 1;
  StructDeserializer<binlog::WriterProp,std::integral_constant<unsigned_long_binlog::WriterProp::*,&binlog::WriterProp::id>,std::integral_constant<std::__cxx11::string_binlog::WriterProp::*,&binlog::WriterProp::name>,std::integral_constant<unsigned_long_binlog::WriterProp::*,&binlog::WriterProp::batchSize>>
  ::deserialize_member<unsigned_long,binlog::Range>
            ((WriterProp *)CONCAT44(in_stack_ffffffffffffffe4,1),in_stack_ffffffffffffffd8,
             (Range *)0x10e919);
  uVar2 = 0;
  StructDeserializer<binlog::WriterProp,std::integral_constant<unsigned_long_binlog::WriterProp::*,&binlog::WriterProp::id>,std::integral_constant<std::__cxx11::string_binlog::WriterProp::*,&binlog::WriterProp::name>,std::integral_constant<unsigned_long_binlog::WriterProp::*,&binlog::WriterProp::batchSize>>
  ::deserialize_member<std::__cxx11::string,binlog::Range>
            ((WriterProp *)(ulong)uVar1,in_stack_ffffffffffffffd8,(Range *)0x10e935);
  StructDeserializer<binlog::WriterProp,std::integral_constant<unsigned_long_binlog::WriterProp::*,&binlog::WriterProp::id>,std::integral_constant<std::__cxx11::string_binlog::WriterProp::*,&binlog::WriterProp::name>,std::integral_constant<unsigned_long_binlog::WriterProp::*,&binlog::WriterProp::batchSize>>
  ::deserialize_member<unsigned_long,binlog::Range>
            ((WriterProp *)CONCAT44(uVar2,uVar1),in_stack_ffffffffffffffd8,(Range *)0x10e951);
  return;
}

Assistant:

static void deserialize(T& t, InputStream& istream)
  {
    using swallow = int[];
    (void)swallow{1, (deserialize_member(t, Members::value, istream), int{})...};
  }